

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

uint_t flexfloat_denorm_frac(flexfloat_t *a,int_fast16_t exp)

{
  ushort uVar1;
  unsigned_short shift;
  int_fast16_t exp_local;
  flexfloat_t *a_local;
  ulong local_8;
  
  if (((ulong)a->value >> 0x34 & 0x7ff) == 0) {
    local_8 = ((ulong)a->value & 0xfffffffffffff) >> (0x34 - (a->desc).frac_bits & 0x3f);
  }
  else {
    uVar1 = (-(short)exp - (ushort)(a->desc).frac_bits) + 0x35;
    if (uVar1 < 0x40) {
      local_8 = ((ulong)a->value & 0xfffffffffffff | 0x10000000000000) >> ((byte)uVar1 & 0x3f);
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

uint_t flexfloat_denorm_frac(const flexfloat_t *a, int_fast16_t exp)
{
    if(EXPONENT(CAST_TO_INT(a->value)) == 0) // Denormalized backend value
    {
        return (CAST_TO_INT(a->value) & MASK_FRAC) >> (NUM_BITS_FRAC - a->desc.frac_bits);
    }
    else // Denormalized target value (in normalized backend value)
    {
        unsigned short shift = NUM_BITS_FRAC - a->desc.frac_bits - exp + 1;
        if(shift >= NUM_BITS) return 0;
        return (((CAST_TO_INT(a->value) & MASK_FRAC) | MASK_FRAC_MSB) >> shift);
    }
}